

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

handle pybind11::detail::list_caster<std::vector<float,std::allocator<float>>,float>::
       cast<std::vector<float,std::allocator<float>>&>
                 (vector<float,_std::allocator<float>_> *src,return_value_policy policy,
                 handle parent)

{
  bool bVar1;
  int iVar2;
  PyObject **ppPVar3;
  undefined8 in_RDX;
  vector<float,_std::allocator<float>_> *in_RDI;
  object value_;
  float *value;
  iterator __end0;
  iterator __begin0;
  vector<float,_std::allocator<float>_> *__range3;
  size_t index;
  list l;
  handle in_stack_ffffffffffffff48;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *in_stack_ffffffffffffff50
  ;
  handle in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff68;
  list *in_stack_ffffffffffffff70;
  handle local_88;
  int local_7c;
  undefined8 local_78;
  PyObject *local_60;
  handle local_58;
  reference local_50;
  float *local_48;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_40;
  vector<float,_std::allocator<float>_> *local_38;
  long local_30;
  handle local_28 [2];
  vector<float,_std::allocator<float>_> *local_18;
  undefined8 local_10;
  handle local_8;
  
  local_18 = in_RDI;
  local_10 = in_RDX;
  std::vector<float,_std::allocator<float>_>::size(in_RDI);
  list::list(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_30 = 0;
  local_38 = local_18;
  local_40._M_current =
       (float *)std::vector<float,_std::allocator<float>_>::begin
                          ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff48.m_ptr)
  ;
  local_48 = (float *)std::vector<float,_std::allocator<float>_>::end
                                ((vector<float,_std::allocator<float>_> *)
                                 in_stack_ffffffffffffff48.m_ptr);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                       in_stack_ffffffffffffff48.m_ptr);
    if (!bVar1) break;
    local_50 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator*(&local_40);
    forward_like<std::vector<float,std::allocator<float>>&,float&>(local_50);
    local_78 = local_10;
    local_60 = (PyObject *)
               type_caster<float,_void>::cast<float>(0.0,automatic,in_stack_ffffffffffffff48);
    reinterpret_steal<pybind11::object>(in_stack_ffffffffffffff58);
    bVar1 = pybind11::handle::operator_cast_to_bool(&local_58);
    if (bVar1) {
      local_88 = object::release(in_stack_ffffffffffffff48.m_ptr);
      ppPVar3 = pybind11::handle::ptr(&local_88);
      in_stack_ffffffffffffff58.m_ptr = *ppPVar3;
      ppPVar3 = pybind11::handle::ptr(local_28);
      iVar2 = PyType_HasFeature((*ppPVar3)->ob_type,0x2000000);
      if (iVar2 == 0) {
        __assert_fail("PyList_Check(l.ptr())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/amlucas[P]sdfTools/src/extern/pybind11/include/pybind11/stl.h"
                      ,0xb2,
                      "static handle pybind11::detail::list_caster<std::vector<float>, float>::cast(T &&, return_value_policy, handle) [Type = std::vector<float>, Value = float, T = std::vector<float> &]"
                     );
      }
      ppPVar3 = pybind11::handle::ptr(local_28);
      (&(((*ppPVar3)[1].ob_type)->ob_base).ob_base.ob_refcnt)[local_30] =
           (Py_ssize_t)in_stack_ffffffffffffff58.m_ptr;
      local_7c = 0;
      local_30 = local_30 + 1;
    }
    else {
      memset(&local_8,0,8);
      pybind11::handle::handle(&local_8);
      local_7c = 1;
    }
    object::~object((object *)0x16ea13);
    if (local_7c != 0) goto LAB_0016ea57;
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&local_40);
  }
  local_8 = object::release(in_stack_ffffffffffffff48.m_ptr);
  local_7c = 1;
LAB_0016ea57:
  list::~list((list *)0x16ea64);
  return (handle)local_8.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }